

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

uint8_vec * __thiscall basist::ktx2_transcoder::find_key(ktx2_transcoder *this,string *key_name)

{
  uint uVar1;
  char *__s2;
  int iVar2;
  uint8_vec *puVar3;
  ulong uVar4;
  
  uVar1 = (this->m_key_values).m_size;
  if ((ulong)uVar1 != 0) {
    __s2 = (key_name->_M_dataplus)._M_p;
    puVar3 = &((this->m_key_values).m_p)->m_value;
    uVar4 = 0;
    do {
      iVar2 = strcmp((char *)puVar3[-1].m_p,__s2);
      if (iVar2 == 0) {
        if ((uint)uVar4 < uVar1) {
          return puVar3;
        }
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                      ,0x177,
                      "const T &basisu::vector<basist::ktx2_transcoder::key_value>::operator[](size_t) const [T = basist::ktx2_transcoder::key_value]"
                     );
      }
      uVar4 = uVar4 + 1;
      puVar3 = puVar3 + 2;
    } while (uVar1 != uVar4);
  }
  return (uint8_vec *)0x0;
}

Assistant:

const basisu::uint8_vec* ktx2_transcoder::find_key(const std::string& key_name) const
	{
		for (uint32_t i = 0; i < m_key_values.size(); i++)
			if (strcmp((const char *)m_key_values[i].m_key.data(), key_name.c_str()) == 0)
				return &m_key_values[i].m_value;

		return nullptr;
	}